

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O1

QStringView __thiscall QXmlStreamReaderPrivate::symView(QXmlStreamReaderPrivate *this,int index)

{
  Value *pVVar1;
  long lVar2;
  CutResult CVar3;
  qsizetype qVar4;
  long lVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  qsizetype local_28;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (long)index + (long)this->tos;
  pVVar1 = this->sym_stack;
  pcVar6 = (this->textBuffer).d.ptr;
  if (pcVar6 == (char16_t *)0x0) {
    pcVar6 = L"";
  }
  lVar2 = pVVar1[lVar5 + -1].pos;
  local_20 = (long)pVVar1[lVar5 + -1].prefix;
  local_28 = -1;
  CVar3 = QtPrivate::QContainerImplHelper::mid(pVVar1[lVar5 + -1].len,&local_20,&local_28);
  if (CVar3 == Null) {
    qVar4 = 0;
    pcVar6 = (char16_t *)0x0;
  }
  else {
    pcVar6 = pcVar6 + lVar2 + local_20;
    qVar4 = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar7.m_data = pcVar6;
    QVar7.m_size = qVar4;
    return QVar7;
  }
  __stack_chk_fail();
}

Assistant:

QStringView symView(int index) const
    {
        const Value &symbol = sym(index);
        return QStringView(textBuffer.data() + symbol.pos, symbol.len).mid(symbol.prefix);
    }